

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_import.cpp
# Opt level: O1

void __thiscall
ComponentImport_multipleImportAndParse_Test::~ComponentImport_multipleImportAndParse_Test
          (ComponentImport_multipleImportAndParse_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ComponentImport, multipleImportAndParse)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"cc1\" name=\"c1\"/>\n"
        "    <component component_ref=\"cc2\" name=\"c2\"/>\n"
        "  </import>\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"cc1\" name=\"c3\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("some-other-model.xml");
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    c1->setName("c1");
    c1->setSourceComponent(imp, "cc1");
    m->addComponent(c1);
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    c2->setName("c2");
    c2->setSourceComponent(imp, "cc2");
    m->addComponent(c2);

    // These have the same URL but a different ImportSource object, so should be separated.
    libcellml::ImportSourcePtr imp2 = libcellml::ImportSource::create();
    imp2->setUrl("some-other-model.xml");
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    c3->setName("c3");
    c3->setSourceComponent(imp2, "cc1");
    m->addComponent(c3);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);

    // Parse
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    EXPECT_EQ(size_t(3), model->componentCount());
    a = printer->printModel(model);
    EXPECT_EQ(e, a);
}